

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fid_cgap.h
# Opt level: O1

ulint __thiscall bwtil::fid_cgap::serialize(fid_cgap *this,ostream *out)

{
  ulong uVar1;
  ulong uVar2;
  ulint uVar3;
  long lVar4;
  pointer pbVar5;
  ulint v_sel_size;
  ulint bsds_size;
  bool b;
  long local_108;
  pointer local_100;
  long local_f8;
  bsd_cgap local_f0;
  
  uVar3 = 8;
  ::std::ostream::write((char *)out,(long)this);
  if (this->W != 0) {
    ::std::ostream::write((char *)out,(long)&this->u);
    ::std::ostream::write((char *)out,(long)&this->n);
    ::std::ostream::write((char *)out,(long)&this->v);
    ::std::ostream::write((char *)out,(long)&this->t);
    ::std::ostream::write((char *)out,(long)&this->number_of_v_blocks);
    ::std::ostream::write((char *)out,(long)&this->number_of_t_blocks);
    local_108 = (long)(this->V_select).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->V_select).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
    ::std::ostream::write((char *)out,(long)&local_108);
    local_f8 = ((long)(this->BSDs).
                      super__Vector_base<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->BSDs).
                      super__Vector_base<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>._M_impl.
                      super__Vector_impl_data._M_start >> 6) * -0x5555555555555555;
    ::std::ostream::write((char *)out,(long)&local_f8);
    cgap_dictionary::serialize(&this->D,out);
    uVar1 = this->number_of_v_blocks;
    if (uVar1 != 0) {
      uVar2 = 0;
      do {
        uVar1 = uVar2 + 0x3f;
        if (-1 < (long)uVar2) {
          uVar1 = uVar2;
        }
        local_f0.D = (cgap_dictionary *)
                     CONCAT71(local_f0.D._1_7_,
                              ((this->V).super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                               [((long)uVar1 >> 6) +
                                (ulong)((uVar2 & 0x800000000000003f) < 0x8000000000000001) +
                                0xffffffffffffffff] >> (uVar2 & 0x3f) & 1) != 0);
        ::std::ostream::write((char *)out,(long)&local_f0);
        uVar2 = uVar2 + 1;
        uVar1 = this->number_of_v_blocks;
      } while (uVar2 < uVar1);
    }
    ::std::ostream::write
              ((char *)out,
               (long)(this->V_rank).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start);
    uVar3 = this->number_of_v_blocks;
    ::std::ostream::write
              ((char *)out,
               (long)(this->V_select).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start);
    lVar4 = uVar3 + local_108;
    ::std::ostream::write
              ((char *)out,
               (long)(this->R).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    uVar3 = this->number_of_v_blocks;
    ::std::ostream::write
              ((char *)out,
               (long)(this->R_1).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    lVar4 = uVar1 + 0x40 + (lVar4 + uVar3 + local_108) * 8;
    pbVar5 = (this->BSDs).super__Vector_base<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_100 = (this->BSDs).super__Vector_base<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (pbVar5 != local_100) {
      do {
        local_f0.D = pbVar5->D;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_f0.C._container,&(pbVar5->C)._container);
        local_f0.W = pbVar5->W;
        local_f0._33_7_ = *(undefined7 *)&pbVar5->field_0x21;
        local_f0.c = pbVar5->c;
        local_f0.logc = pbVar5->logc;
        local_f0.logu = pbVar5->logu;
        local_f0._50_6_ = *(undefined6 *)&pbVar5->field_0x32;
        local_f0.tail = pbVar5->tail;
        local_f0.u = pbVar5->u;
        local_f0.n = pbVar5->n;
        local_f0.t = pbVar5->t;
        local_f0._84_4_ = *(undefined4 *)&pbVar5->field_0x54;
        local_f0.number_of_blocks = pbVar5->number_of_blocks;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0.first_el,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pbVar5->first_el);
        local_f0.first_el._field_mask = (pbVar5->first_el)._field_mask;
        local_f0.first_el._size = (pbVar5->first_el)._size;
        local_f0.first_el._width = (pbVar5->first_el)._width;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0.C_addr,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pbVar5->C_addr);
        local_f0.C_addr._field_mask = (pbVar5->C_addr)._field_mask;
        local_f0.C_addr._size = (pbVar5->C_addr)._size;
        local_f0.C_addr._width = (pbVar5->C_addr)._width;
        uVar3 = bsd_cgap::serialize(&local_f0,out);
        if (local_f0.C_addr._bits._container.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f0.C_addr._bits._container.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_f0.first_el._bits._container.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f0.first_el._bits._container.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_f0.C._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f0.C._container.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        lVar4 = lVar4 + uVar3;
        pbVar5 = pbVar5 + 1;
      } while (pbVar5 != local_100);
    }
    ::std::ostream::write
              ((char *)out,
               (long)(this->SEL).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    uVar3 = lVar4 + this->number_of_t_blocks * 8;
  }
  return uVar3;
}

Assistant:

ulint serialize(std::ostream& out){

		out.write((char *)&W, sizeof(ulint));

		if(W==0) return sizeof(ulint);

		out.write((char *)&u, sizeof(ulint));
		out.write((char *)&n, sizeof(ulint));
		out.write((char *)&v, sizeof(ulint));
		out.write((char *)&t, sizeof(ulint));
		out.write((char *)&number_of_v_blocks, sizeof(ulint));
		out.write((char *)&number_of_t_blocks, sizeof(ulint));

		ulint v_sel_size = V_select.size();
		out.write((char *)&v_sel_size, sizeof(ulint));

		ulint bsds_size = BSDs.size();
		out.write((char *)&bsds_size, sizeof(ulint));

		ulint w_bytes = 8*sizeof(ulint);

		D.serialize(out);

		for(ulint i=0;i<number_of_v_blocks;++i){
			bool b = V[i];
			out.write((char *)&b, sizeof(bool));
		}

		w_bytes += number_of_v_blocks*sizeof(bool);

		out.write((char *)V_rank.data(), number_of_v_blocks*sizeof(ulint));
		w_bytes += number_of_v_blocks*sizeof(ulint);

		out.write((char *)V_select.data(), v_sel_size*sizeof(ulint));
		w_bytes += v_sel_size*sizeof(ulint);

		out.write((char *)R.data(), number_of_v_blocks*sizeof(ulint));
		w_bytes += number_of_v_blocks*sizeof(ulint);

		out.write((char *)R_1.data(), v_sel_size*sizeof(ulint));
		w_bytes += v_sel_size*sizeof(ulint);

		for(auto bsd : BSDs)
			w_bytes += bsd.serialize(out);

		out.write((char *)SEL.data(), number_of_t_blocks*sizeof(ulint));
		w_bytes += number_of_t_blocks*sizeof(ulint);

		return w_bytes;

	}